

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::ninjaVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  string command;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ninjaCmd_abi_cxx11_(&local_50,this);
  std::operator+(&local_30,&local_50," --version");
  std::__cxx11::string::~string((string *)&local_50);
  cmSystemTools::RunSingleCommand
            (local_30._M_dataplus._M_p,__return_storage_ptr__,(string *)0x0,(int *)0x0,(char *)0x0,
             OUTPUT_NONE,0.0);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaVersion() const
{
  std::string version;
  std::string command = ninjaCmd() + " --version";
  cmSystemTools::RunSingleCommand(command.c_str(),
                                  &version, 0, 0, 0,
                                  cmSystemTools::OUTPUT_NONE);

  return version;
}